

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O3

DescriptorPoolWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateDescriptorPool
          (DescriptorPoolWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,
          VkDescriptorPoolCreateInfo *DescrPoolCI,char *DebugName)

{
  string msg;
  string local_48;
  
  if (DescrPoolCI->sType != VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO) {
    Diligent::FormatString<char[26],char[67]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DescrPoolCI.sType == VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO",
               (char (*) [67])DebugName);
    Diligent::DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CreateDescriptorPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x15c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  CreateVulkanObject<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14,VkResult(*)(VkDevice_T*,VkDescriptorPoolCreateInfo_const*,VkAllocationCallbacks_const*,VkDescriptorPool_T**),VkDescriptorPoolCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkDescriptorPoolCreateInfo_ptr_VkAllocationCallbacks_ptr_VkDescriptorPool_T_ptr_ptr
              *)vkCreateDescriptorPool,DescrPoolCI,DebugName,"descriptor pool");
  return __return_storage_ptr__;
}

Assistant:

DescriptorPoolWrapper VulkanLogicalDevice::CreateDescriptorPool(const VkDescriptorPoolCreateInfo& DescrPoolCI, const char* DebugName) const
{
    VERIFY_EXPR(DescrPoolCI.sType == VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO);
    return CreateVulkanObject<VkDescriptorPool, VulkanHandleTypeId::DescriptorPool>(vkCreateDescriptorPool, DescrPoolCI, DebugName, "descriptor pool");
}